

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# demo_CH_archive.cpp
# Opt level: O1

void __thiscall
myEmployeeCustomConstructor::ArchiveOUTconstructor
          (myEmployeeCustomConstructor *this,ChArchiveOut *marchive)

{
  char *local_38;
  double *local_30;
  undefined1 local_28;
  
  chrono::ChArchiveOut::VersionWrite<myEmployeeCustomConstructor>(marchive);
  local_30 = &this->latitude;
  local_38 = "latitude";
  local_28 = 0;
  (*(marchive->super_ChArchive)._vptr_ChArchive[4])(marchive,&local_38);
  local_30 = (double *)&this->kids;
  local_38 = "kids";
  local_28 = 0;
  (*(marchive->super_ChArchive)._vptr_ChArchive[3])(marchive,&local_38);
  return;
}

Assistant:

virtual void ArchiveOUTconstructor(ChArchiveOut& marchive)
    {
        // suggested: use versioning
        marchive.VersionWrite<myEmployeeCustomConstructor>();

        // serialize the parameters of the constructor:
        marchive << CHNVP(latitude);
        marchive << CHNVP(kids);
    }